

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_rewrite_module.c
# Opt level: O1

char * ngx_http_rewrite_merge_loc_conf(ngx_conf_t *cf,void *parent,void *child)

{
  ngx_array_t *a;
  undefined8 *puVar1;
  char *pcVar2;
  long lVar3;
  ngx_http_rewrite_loc_conf_t *conf;
  ngx_http_rewrite_loc_conf_t *prev;
  
  if (*(long *)((long)child + 0x10) == -1) {
    lVar3 = 0;
    if (*(long *)((long)parent + 0x10) != -1) {
      lVar3 = *(long *)((long)parent + 0x10);
    }
    *(long *)((long)child + 0x10) = lVar3;
  }
  if (*(long *)((long)child + 0x18) == -1) {
    lVar3 = 1;
    if (*(long *)((long)parent + 0x18) != -1) {
      lVar3 = *(long *)((long)parent + 0x18);
    }
    *(long *)((long)child + 0x18) = lVar3;
  }
  if (*(long *)((long)child + 8) == -1) {
    lVar3 = 10;
    if (*(long *)((long)parent + 8) != -1) {
      lVar3 = *(long *)((long)parent + 8);
    }
    *(long *)((long)child + 8) = lVar3;
  }
  a = *child;
  if ((a != (ngx_array_t *)0x0) && (a != *parent)) {
    puVar1 = (undefined8 *)ngx_array_push_n(a,8);
    if (puVar1 == (undefined8 *)0x0) {
      pcVar2 = (char *)0xffffffffffffffff;
    }
    else {
      *puVar1 = 0;
      pcVar2 = (char *)0x0;
    }
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_rewrite_merge_loc_conf(ngx_conf_t *cf, void *parent, void *child)
{
    ngx_http_rewrite_loc_conf_t *prev = parent;
    ngx_http_rewrite_loc_conf_t *conf = child;

    uintptr_t  *code;

    ngx_conf_merge_value(conf->log, prev->log, 0);
    ngx_conf_merge_value(conf->uninitialized_variable_warn,
                         prev->uninitialized_variable_warn, 1);
    ngx_conf_merge_uint_value(conf->stack_size, prev->stack_size, 10);

    if (conf->codes == NULL) {
        return NGX_CONF_OK;
    }

    if (conf->codes == prev->codes) {
        return NGX_CONF_OK;
    }

    code = ngx_array_push_n(conf->codes, sizeof(uintptr_t));
    if (code == NULL) {
        return NGX_CONF_ERROR;
    }

    *code = (uintptr_t) NULL;

    return NGX_CONF_OK;
}